

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::loada(VM *this,u2 level_diff,addr_t offset)

{
  size_type sVar1;
  reference pvVar2;
  uint local_20;
  addr_t bp;
  int ld;
  int staticLink;
  addr_t offset_local;
  u2 level_diff_local;
  VM *this_local;
  
  sVar1 = std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::size(&this->_contexts);
  bp = (int)sVar1 + -1;
  for (local_20 = (uint)level_diff; 0 < (int)local_20; local_20 = local_20 - 1) {
    pvVar2 = std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::at
                       (&this->_contexts,(long)bp);
    bp = pvVar2->staticLink;
  }
  pvVar2 = std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::at
                     (&this->_contexts,(long)bp);
  PUSH<int>(this,pvVar2->BP + offset);
  return;
}

Assistant:

void VM::loada(u2 level_diff, addr_t offset) {
    int staticLink = _contexts.size()-1;
    for (int ld = level_diff; ld > 0; --ld) {
        staticLink = _contexts.at(staticLink).staticLink;
    }
    addr_t bp = _contexts.at(staticLink).BP;
    PUSH<addr_t>(bp+offset);
}